

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

void cross_validation(problem *prob,parameter *param,int nr_fold,double *target)

{
  uint uVar1;
  undefined4 uVar2;
  int iVar3;
  void *__ptr;
  void *__ptr_00;
  ulong uVar4;
  long lVar5;
  model *model_;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  problem subprob;
  model *submodel;
  
  uVar9 = (ulong)(uint)nr_fold;
  uVar1 = prob->l;
  __ptr = malloc((long)(int)uVar1 * 4);
  if ((int)uVar1 < nr_fold) {
    fwrite("WARNING: # folds > # data. Will use # folds = # data instead (i.e., leave-one-out cross validation)\n"
           ,100,1,_stderr);
    uVar9 = (ulong)uVar1;
  }
  iVar8 = (int)uVar9;
  __ptr_00 = malloc((long)iVar8 * 4 + 4);
  uVar4 = 0;
  uVar10 = 0;
  if (0 < (int)uVar1) {
    uVar10 = (ulong)uVar1;
  }
  for (; uVar10 != uVar4; uVar4 = uVar4 + 1) {
    *(int *)((long)__ptr + uVar4 * 4) = (int)uVar4;
  }
  uVar7 = uVar1;
  for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
    iVar3 = rand();
    lVar5 = (long)(iVar3 % (int)uVar7) + uVar4;
    uVar2 = *(undefined4 *)((long)__ptr + uVar4 * 4);
    *(undefined4 *)((long)__ptr + uVar4 * 4) = *(undefined4 *)((long)__ptr + lVar5 * 4);
    *(undefined4 *)((long)__ptr + lVar5 * 4) = uVar2;
    uVar7 = uVar7 - 1;
  }
  iVar3 = 0;
  for (lVar5 = 0; lVar5 <= iVar8; lVar5 = lVar5 + 1) {
    *(int *)((long)__ptr_00 + lVar5 * 4) = iVar3 / iVar8;
    iVar3 = iVar3 + uVar1;
  }
  uVar4 = 0;
  if (iVar8 < 1) {
    uVar9 = uVar4;
  }
  while (uVar4 != uVar9) {
    uVar7 = *(uint *)((long)__ptr_00 + uVar4 * 4);
    lVar5 = (long)(int)uVar7;
    iVar8 = *(int *)((long)__ptr_00 + uVar4 * 4 + 4);
    uVar4 = uVar4 + 1;
    subprob.bias = prob->bias;
    subprob.n = prob->n;
    subprob.l = (uVar7 - iVar8) + uVar1;
    lVar11 = (long)subprob.l;
    subprob.x = (feature_node **)malloc(lVar11 << 3);
    subprob.y = (double *)malloc(lVar11 << 3);
    uVar10 = 0;
    if (0 < (int)uVar7) {
      uVar10 = (ulong)uVar7;
    }
    for (uVar6 = 0; lVar11 = (long)iVar8, uVar10 != uVar6; uVar6 = uVar6 + 1) {
      iVar3 = *(int *)((long)__ptr + uVar6 * 4);
      subprob.x[uVar6] = prob->x[iVar3];
      subprob.y[uVar6] = prob->y[iVar3];
    }
    for (; lVar11 < (int)uVar1; lVar11 = lVar11 + 1) {
      iVar3 = *(int *)((long)__ptr + lVar11 * 4);
      subprob.x[uVar10] = prob->x[iVar3];
      subprob.y[uVar10] = prob->y[iVar3];
      uVar10 = uVar10 + 1;
    }
    model_ = train(&subprob,param);
    submodel = model_;
    for (; lVar5 < iVar8; lVar5 = lVar5 + 1) {
      iVar3 = *(int *)((long)__ptr + lVar5 * 4);
      dVar12 = predict(model_,prob->x[iVar3]);
      target[iVar3] = dVar12;
    }
    free_and_destroy_model(&submodel);
    free(subprob.x);
    free(subprob.y);
  }
  free(__ptr_00);
  free(__ptr);
  return;
}

Assistant:

void cross_validation(const problem *prob, const parameter *param, int nr_fold, double *target)
{
	int i;
	int *fold_start;
	int l = prob->l;
	int *perm = Malloc(int,l);
	if (nr_fold > l)
	{
		nr_fold = l;
		fprintf(stderr,"WARNING: # folds > # data. Will use # folds = # data instead (i.e., leave-one-out cross validation)\n");
	}
	fold_start = Malloc(int,nr_fold+1);
	for(i=0;i<l;i++) perm[i]=i;
	for(i=0;i<l;i++)
	{
		int j = i+rand()%(l-i);
		swap(perm[i],perm[j]);
	}
	for(i=0;i<=nr_fold;i++)
		fold_start[i]=i*l/nr_fold;

#ifdef CV_OMP
#pragma omp parallel for private(i) schedule(dynamic)
#endif
	for(i=0;i<nr_fold;i++)
	{
		int begin = fold_start[i];
		int end = fold_start[i+1];
		int j,k;
		struct problem subprob;

		subprob.bias = prob->bias;
		subprob.n = prob->n;
		subprob.l = l-(end-begin);
		subprob.x = Malloc(struct feature_node*,subprob.l);
		subprob.y = Malloc(double,subprob.l);

		k=0;
		for(j=0;j<begin;j++)
		{
			subprob.x[k] = prob->x[perm[j]];
			subprob.y[k] = prob->y[perm[j]];
			++k;
		}
		for(j=end;j<l;j++)
		{
			subprob.x[k] = prob->x[perm[j]];
			subprob.y[k] = prob->y[perm[j]];
			++k;
		}
		struct model *submodel = train(&subprob,param);
		for(j=begin;j<end;j++)
			target[perm[j]] = predict(submodel,prob->x[perm[j]]);
		free_and_destroy_model(&submodel);
		free(subprob.x);
		free(subprob.y);
	}
	free(fold_start);
	free(perm);
}